

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::SharedCtor(FileOptions *this)

{
  internal::InitSCC(&scc_info_FileOptions_google_2fprotobuf_2fdescriptor_2eproto.base);
  (this->java_package_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->java_outer_classname_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->go_package_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->objc_class_prefix_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->csharp_namespace_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->swift_prefix_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->php_class_prefix_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->php_namespace_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->php_metadata_namespace_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->ruby_package_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  this->java_multiple_files_ = false;
  this->java_generate_equals_and_hash_ = false;
  this->java_string_check_utf8_ = false;
  this->cc_generic_services_ = false;
  this->java_generic_services_ = false;
  this->py_generic_services_ = false;
  this->php_generic_services_ = false;
  this->deprecated_ = false;
  this->cc_enable_arenas_ = false;
  this->optimize_for_ = 1;
  return;
}

Assistant:

void FileOptions::SharedCtor() {
  ::PROTOBUF_NAMESPACE_ID::internal::InitSCC(&scc_info_FileOptions_google_2fprotobuf_2fdescriptor_2eproto.base);
  java_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  java_outer_classname_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  go_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  objc_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  csharp_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  swift_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  php_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  php_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  php_metadata_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  ruby_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  ::memset(&java_multiple_files_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&cc_enable_arenas_) -
      reinterpret_cast<char*>(&java_multiple_files_)) + sizeof(cc_enable_arenas_));
  optimize_for_ = 1;
}